

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnsStats.cpp
# Opt level: O3

void __thiscall TldAsKey::TldAsKey(TldAsKey *this,uint8_t *tld,size_t tld_len)

{
  uint8_t uVar1;
  size_t sVar2;
  size_t sVar3;
  uint8_t uVar4;
  
  this->HashNext = (TldAsKey *)0x0;
  this->MoreRecentKey = (TldAsKey *)0x0;
  this->LessRecentKey = (TldAsKey *)0x0;
  this->max_name_parts = 1;
  this->count = 1;
  this->hash = 0;
  sVar2 = 0x40;
  if (tld_len < 0x40) {
    sVar2 = tld_len;
  }
  if (tld_len != 0) {
    sVar3 = 0;
    do {
      uVar1 = tld[sVar3];
      uVar4 = uVar1 + 0xe0;
      if (0x19 < (byte)(uVar1 + 0x9f)) {
        uVar4 = uVar1;
      }
      this->tld[sVar3] = uVar4;
      sVar3 = sVar3 + 1;
    } while (sVar2 != sVar3);
  }
  this->tld_len = sVar2;
  this->tld[sVar2] = '\0';
  return;
}

Assistant:

TldAsKey::TldAsKey(uint8_t * tld, size_t tld_len)
    :
    HashNext(NULL),
    MoreRecentKey(NULL),
    LessRecentKey(NULL),
    max_name_parts(1),
    count(1),
    hash(0)
{
    CanonicCopy(this->tld, sizeof(this->tld) - 1, &this->tld_len, tld, tld_len);
}